

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::ast::SFormat::formatInt
               (string *result,SVInt *value,LiteralBase base,FormatOptions *options)

{
  bool bVar1;
  uint *puVar2;
  size_type sVar3;
  long in_RCX;
  char in_DL;
  SVInt *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar4;
  anon_class_32_4_0e84af77 doPad;
  bitwidth_t bw;
  uint32_t width;
  SVInt copy;
  SmallVector<char,_40UL> buffer;
  bitwidth_t in_stack_000001b0;
  bool in_stack_000001b6;
  LiteralBase in_stack_000001b7;
  SmallVectorBase<char> *in_stack_000001b8;
  SVInt *in_stack_000001c0;
  SVInt *in_stack_ffffffffffffff28;
  SmallVectorBase<char> *this;
  SVInt *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  bitwidth_t in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *__first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint local_84;
  SVInt local_80 [2];
  SmallVectorBase<char> local_60 [2];
  long local_20;
  char local_11;
  SVInt *local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x91eaa2);
  if (local_11 != '\x02') {
    bVar1 = SVInt::isSigned(local_10);
    in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
    if (bVar1) {
      SVInt::SVInt(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      SVInt::setSigned(local_80,false);
      SVInt::writeTo(in_stack_000001c0,in_stack_000001b8,in_stack_000001b7,in_stack_000001b6,
                     in_stack_000001b0);
      SVInt::~SVInt((SVInt *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      goto LAB_0091eb72;
    }
  }
  SVInt::writeTo(in_stack_000001c0,in_stack_000001b8,in_stack_000001b7,in_stack_000001b6,
                 in_stack_000001b0);
LAB_0091eb72:
  local_84 = 0;
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x91eb87);
  if (bVar1) {
    puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x91eb9a);
    local_84 = *puVar2;
  }
  else {
    in_stack_ffffffffffffff50 = SVInt::getBitWidth(local_10);
    switch(local_11) {
    case '\0':
      local_84 = in_stack_ffffffffffffff50;
      break;
    case '\x01':
      dVar4 = ceil((double)in_stack_ffffffffffffff50 / 3.0);
      local_84 = (uint)(long)dVar4;
      break;
    case '\x02':
      dVar4 = ceil((double)in_stack_ffffffffffffff50 / log2_10);
      local_84 = (uint)(long)dVar4;
      in_stack_ffffffffffffff47 = SVInt::isSigned(local_10);
      if ((bool)in_stack_ffffffffffffff47) {
        local_84 = local_84 + 1;
      }
      break;
    case '\x03':
      dVar4 = ceil((double)in_stack_ffffffffffffff50 * 0.25);
      local_84 = (uint)(long)dVar4;
    }
  }
  __first = &local_11;
  sVar3 = SmallVectorBase<char>::size(local_60);
  this_00 = local_8;
  if ((sVar3 < local_84) && ((*(byte *)(local_20 + 0x10) & 1) == 0)) {
    formatInt::anon_class_32_4_0e84af77::operator()
              ((anon_class_32_4_0e84af77 *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    this_00 = local_8;
  }
  this = local_60;
  SmallVectorBase<char>::begin(this);
  SmallVectorBase<char>::end(this);
  std::__cxx11::string::append<char*,void>
            (this_00,__first,(char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  sVar3 = SmallVectorBase<char>::size(local_60);
  if ((sVar3 < local_84) && ((*(byte *)(local_20 + 0x10) & 1) != 0)) {
    formatInt::anon_class_32_4_0e84af77::operator()
              ((anon_class_32_4_0e84af77 *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  }
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x91ed65);
  return;
}

Assistant:

void formatInt(std::string& result, const SVInt& value, LiteralBase base,
               const FormatOptions& options) {
    SmallVector<char> buffer;
    if (base != LiteralBase::Decimal && value.isSigned()) {
        // Non-decimal bases don't print as signed ever.
        SVInt copy = value;
        copy.setSigned(false);
        copy.writeTo(buffer, base, /* includeBase */ false);
    }
    else {
        value.writeTo(buffer, base, /* includeBase */ false);
    }

    // If no width is specified we need to calculate it ourselves based on the bitwidth
    // of the provided integer.
    uint32_t width = 0;
    if (options.width)
        width = *options.width;
    else {
        bitwidth_t bw = value.getBitWidth();
        switch (base) {
            case LiteralBase::Binary:
                width = bw;
                break;
            case LiteralBase::Octal:
                width = uint32_t(std::ceil(bw / 3.0));
                break;
            case LiteralBase::Hex:
                width = uint32_t(std::ceil(bw / 4.0));
                break;
            case LiteralBase::Decimal:
                width = uint32_t(std::ceil(bw / log2_10));
                if (value.isSigned())
                    width++;
                break;
        }
    }

    auto doPad = [&] {
        char pad = '0';
        if (base == LiteralBase::Decimal)
            pad = ' ';

        result.append(width - buffer.size(), pad);
    };

    if (buffer.size() < width && !options.leftJustify)
        doPad();

    result.append(buffer.begin(), buffer.end());

    if (buffer.size() < width && options.leftJustify)
        doPad();
}